

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linecurve.cpp
# Opt level: O0

ON_LineCurve * __thiscall ON_LineCurve::operator=(ON_LineCurve *this,ON_LineCurve *src)

{
  ON_LineCurve *src_local;
  ON_LineCurve *this_local;
  
  if (this != src) {
    ON_Curve::operator=(&this->super_ON_Curve,&src->super_ON_Curve);
    memcpy(&this->m_line,&src->m_line,0x30);
    (this->m_t).m_t[0] = (src->m_t).m_t[0];
    (this->m_t).m_t[1] = (src->m_t).m_t[1];
    this->m_dim = src->m_dim;
  }
  return this;
}

Assistant:

ON_LineCurve& ON_LineCurve::operator=( const ON_LineCurve& src )
{
  if ( this != &src ) 
  {
    ON_Curve::operator=(src); // copies userdata
    m_line = src.m_line;
    m_t = src.m_t;
    m_dim  = src.m_dim;
  }
  return *this;
}